

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O1

void __thiscall sqlite::database_binder::~database_binder(database_binder *this)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  database_binder *__range1;
  row_iterator local_30;
  
  if (this->execution_started == false) {
    iVar1 = (this->_has_uncaught_exception).count;
    iVar3 = std::uncaught_exceptions();
    if ((iVar1 == iVar3) &&
       ((this->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
        super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
        super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl != (sqlite3_stmt *)0x0)) {
      local_30.value.next_index = 0;
      local_30._binder = this;
      local_30.value._binder = this;
      _next_index(this);
      this->_inx = 0;
      this->execution_started = true;
      row_iterator::operator++(&local_30);
      if (local_30._binder != (database_binder *)0x0) {
        do {
          row_iterator::operator++(&local_30);
        } while (local_30._binder != (database_binder *)0x0);
      }
    }
  }
  psVar2 = (this->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
           super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
           super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl;
  if (psVar2 != (sqlite3_stmt *)0x0) {
    (*(this->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
      super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
      super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
      super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>._M_head_impl)(psVar2);
  }
  (this->_stmt)._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
  super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
  super__Head_base<0UL,_sqlite3_stmt_*,_false>._M_head_impl = (sqlite3_stmt *)0x0;
  this_00 = (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

~database_binder() noexcept(false) {
			/* Will be executed if no >>op is found, but not if an exception
			is in mid flight */
			if(!used() && !_has_uncaught_exception && _stmt) {
				execute();
			}
		}